

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::MessageOptions::_InternalParse(MessageOptions *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  uint uVar5;
  UninterpretedOption *msg;
  char cVar6;
  uint32 uVar7;
  uint tag;
  char cVar8;
  uint uVar9;
  pair<const_char_*,_unsigned_int> pVar10;
  pair<const_char_*,_unsigned_long> pVar11;
  pair<const_char_*,_bool> pVar12;
  
  uVar9 = 0;
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar12._8_8_ = 0;
      pVar12.first = ptr;
    }
    else {
      pVar12._8_8_ = 1;
      pVar12.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar12 = internal::EpsCopyInputStream::DoneFallback
                           (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    ptr = pVar12.first;
    if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_00348cae;
    bVar1 = *ptr;
    pVar10.second._0_1_ = bVar1;
    pVar10.first = (char *)((byte *)ptr + 1);
    pVar10._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      uVar7 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar10 = internal::ReadTagFallback(ptr,uVar7);
      }
      else {
        pVar10.second = uVar7;
        pVar10.first = (char *)((byte *)ptr + 2);
        pVar10._12_4_ = 0;
      }
    }
    ptr = pVar10.first;
    cVar8 = '\x04';
    if ((byte *)ptr != (byte *)0x0) {
      tag = pVar10.second;
      uVar5 = (uint)(pVar10._8_8_ >> 3) & 0x1fffffff;
      cVar6 = (char)pVar10.second;
      switch(uVar5) {
      case 1:
        if (cVar6 == '\b') {
          bVar1 = *ptr;
          pVar11.second = (long)(char)bVar1;
          pVar11.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar1 < 0) {
            bVar2 = ((byte *)ptr)[1];
            uVar7 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            if ((char)bVar2 < '\0') {
              pVar11 = internal::VarintParseSlow64(ptr,uVar7);
            }
            else {
              pVar11.second._0_4_ = uVar7;
              pVar11.first = (char *)((byte *)ptr + 2);
              pVar11.second._4_4_ = 0;
            }
          }
          uVar9 = uVar9 | 1;
          this->message_set_wire_format_ = pVar11.second != 0;
LAB_00348c5a:
          ptr = pVar11.first;
          cVar8 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
          goto LAB_00348c6d;
        }
        break;
      case 2:
        if (cVar6 == '\x10') {
          bVar1 = *ptr;
          pVar11.second = (long)(char)bVar1;
          pVar11.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar1 < 0) {
            bVar2 = ((byte *)ptr)[1];
            uVar7 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            if ((char)bVar2 < '\0') {
              pVar11 = internal::VarintParseSlow64(ptr,uVar7);
            }
            else {
              pVar11.second._0_4_ = uVar7;
              pVar11.first = (char *)((byte *)ptr + 2);
              pVar11.second._4_4_ = 0;
            }
          }
          uVar9 = uVar9 | 2;
          this->no_standard_descriptor_accessor_ = pVar11.second != 0;
          goto LAB_00348c5a;
        }
        break;
      case 3:
        if (cVar6 == '\x18') {
          bVar1 = *ptr;
          pVar11.second = (long)(char)bVar1;
          pVar11.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar1 < 0) {
            bVar2 = ((byte *)ptr)[1];
            uVar7 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            if ((char)bVar2 < '\0') {
              pVar11 = internal::VarintParseSlow64(ptr,uVar7);
            }
            else {
              pVar11.second._0_4_ = uVar7;
              pVar11.first = (char *)((byte *)ptr + 2);
              pVar11.second._4_4_ = 0;
            }
          }
          uVar9 = uVar9 | 4;
          this->deprecated_ = pVar11.second != 0;
          goto LAB_00348c5a;
        }
        break;
      case 4:
      case 5:
      case 6:
        break;
      case 7:
        if (cVar6 == '8') {
          bVar1 = *ptr;
          pVar11.second = (long)(char)bVar1;
          pVar11.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar1 < 0) {
            bVar2 = ((byte *)ptr)[1];
            uVar7 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            if ((char)bVar2 < '\0') {
              pVar11 = internal::VarintParseSlow64(ptr,uVar7);
            }
            else {
              pVar11.second._0_4_ = uVar7;
              pVar11.first = (char *)((byte *)ptr + 2);
              pVar11.second._4_4_ = 0;
            }
          }
          uVar9 = uVar9 | 8;
          this->map_entry_ = pVar11.second != 0;
          goto LAB_00348c5a;
        }
        break;
      default:
        if ((uVar5 == 999) && (cVar6 == ':')) {
          ptr = (char *)((byte *)ptr + -2);
          do {
            pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_00348a46:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
                         (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_00348a55:
              pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
              pRVar4->allocated_size = pRVar4->allocated_size + 1;
              msg = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                              ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_);
              pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
              (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar4->elements[iVar3] = msg;
            }
            else {
              iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar3) {
                if (pRVar4->allocated_size ==
                    (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_00348a46;
                goto LAB_00348a55;
              }
              (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              msg = (UninterpretedOption *)pRVar4->elements[iVar3];
            }
            ptr = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                            (ctx,msg,(char *)((byte *)ptr + 2));
            if ((byte *)ptr == (byte *)0x0) goto LAB_00348c6d;
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*(short *)ptr == 0x3eba));
          cVar8 = '\x02';
          goto LAB_00348c6d;
        }
      }
      if (tag == 0 || (tag & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        cVar8 = '\t';
      }
      else {
        if (tag < 8000) {
          ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
        }
        else {
          ptr = internal::ExtensionSet::ParseField
                          (&this->_extensions_,pVar10._8_8_ & 0xffffffff,ptr,
                           (Message *)_MessageOptions_default_instance_,&this->_internal_metadata_,
                           ctx);
        }
        cVar8 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
      }
    }
LAB_00348c6d:
  } while (cVar8 == '\x02');
  if (cVar8 == '\x04') {
    ptr = (char *)0x0;
  }
LAB_00348cae:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar9;
  return (char *)(byte *)ptr;
}

Assistant:

const char* MessageOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional bool message_set_wire_format = 1 [default = false];
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          _Internal::set_has_message_set_wire_format(&has_bits);
          message_set_wire_format_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool no_standard_descriptor_accessor = 2 [default = false];
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_no_standard_descriptor_accessor(&has_bits);
          no_standard_descriptor_accessor_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool deprecated = 3 [default = false];
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool map_entry = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 56)) {
          _Internal::set_has_map_entry(&has_bits);
          map_entry_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}